

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O0

char * Assimp::FBX::Util::TokenTypeString(TokenType t)

{
  char *pcStack_10;
  TokenType t_local;
  
  switch(t) {
  case TokenType_OPEN_BRACKET:
    pcStack_10 = "TOK_OPEN_BRACKET";
    break;
  case TokenType_CLOSE_BRACKET:
    pcStack_10 = "TOK_CLOSE_BRACKET";
    break;
  case TokenType_DATA:
    pcStack_10 = "TOK_DATA";
    break;
  case TokenType_BINARY_DATA:
    pcStack_10 = "TOK_BINARY_DATA";
    break;
  case TokenType_COMMA:
    pcStack_10 = "TOK_COMMA";
    break;
  case TokenType_KEY:
    pcStack_10 = "TOK_KEY";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* TokenTypeString(TokenType t)
{
    switch(t) {
        case TokenType_OPEN_BRACKET:
            return "TOK_OPEN_BRACKET";

        case TokenType_CLOSE_BRACKET:
            return "TOK_CLOSE_BRACKET";

        case TokenType_DATA:
            return "TOK_DATA";

        case TokenType_COMMA:
            return "TOK_COMMA";

        case TokenType_KEY:
            return "TOK_KEY";

        case TokenType_BINARY_DATA:
            return "TOK_BINARY_DATA";
    }

    ai_assert(false);
    return "";
}